

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

execution_plan<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> * __thiscall
nonius::benchmark::prepare<std::chrono::_V2::system_clock>
          (benchmark *this,configuration *cfg,parameters *params,
          environment<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> env)

{
  duration<double,_std::ratio<1L,_1000000000L>_> estimated_duration;
  duration<double,_std::ratio<1L,_1000000000L>_> warmup_time;
  duration<long,_std::ratio<1L,_1000000000L>_> dVar1;
  duration<long,_std::ratio<1L,_1000000000L>_> __d;
  benchmark_function *in_RDX;
  execution_plan<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *in_RDI;
  duration<double,_std::ratio<1L,_1000000000L>_> params_00;
  benchmark_function *benchmark;
  TimingOf<std::chrono::_V2::system_clock,_nonius::detail::benchmark_function_&(run_for_at_least_argument_t<system_clock,_benchmark_function_&>)>
  TVar2;
  int new_iters;
  TimingOf<std::chrono::_V2::system_clock,_nonius::detail::benchmark_function_&(run_for_at_least_argument_t<system_clock,_benchmark_function_&>)>
  *test;
  duration<double,_std::ratio<1L,_1000000000L>_> run_time;
  duration<double,_std::ratio<1L,_1000000000L>_> min_time;
  benchmark_function bench;
  parameters *in_stack_fffffffffffffe38;
  parameters *in_stack_fffffffffffffe40;
  duration<double,_std::ratio<1L,_1000000000L>_> *in_stack_fffffffffffffe48;
  duration<double,_std::ratio<1L,_1000000000L>_> *in_stack_fffffffffffffe50;
  benchmark_function *in_stack_fffffffffffffe78;
  undefined8 in_stack_fffffffffffffe80;
  int iVar3;
  parameters *in_stack_fffffffffffffea0;
  TimingOf<std::chrono::_V2::system_clock,_nonius::detail::benchmark_function_&(run_for_at_least_argument_t<system_clock,_benchmark_function_&>)>
  local_a0;
  TimingOf<std::chrono::_V2::system_clock,_nonius::detail::benchmark_function_&(run_for_at_least_argument_t<system_clock,_benchmark_function_&>)>
  *local_90;
  rep local_88;
  rep local_80;
  rep local_78;
  
  iVar3 = (int)((ulong)in_stack_fffffffffffffe80 >> 0x20);
  parameters::parameters(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  nonius::detail::benchmark_function::operator()(in_RDX,in_stack_fffffffffffffea0);
  parameters::~parameters((parameters *)0x24cfe1);
  local_78 = (rep)std::chrono::operator*(in_stack_fffffffffffffe48,(int *)in_stack_fffffffffffffe40)
  ;
  local_88 = (rep)std::chrono::
                  duration_cast<std::chrono::duration<double,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000l>>
                            ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffe38);
  estimated_duration.__r =
       (rep)std::max<std::chrono::duration<double,std::ratio<1l,1000000000l>>>
                      ((duration<double,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffe38,
                       (duration<double,_std::ratio<1L,_1000000000L>_> *)0x24d044);
  local_80 = ((duration<double,_std::ratio<1L,_1000000000L>_> *)estimated_duration.__r)->__r;
  warmup_time.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,double,std::ratio<1l,1000000000l>>
                      ((duration<double,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffe38);
  TVar2 = nonius::detail::
          run_for_at_least<std::chrono::_V2::system_clock,nonius::detail::benchmark_function&>
                    ((parameters *)warmup_time.__r,
                     (Duration<std::chrono::_V2::system_clock>)estimated_duration.__r,iVar3,
                     in_stack_fffffffffffffe78);
  local_90 = &local_a0;
  local_a0 = TVar2;
  params_00 = std::chrono::operator*(in_stack_fffffffffffffe48,(int *)in_stack_fffffffffffffe40);
  benchmark = (benchmark_function *)
              std::chrono::operator/
                        (in_stack_fffffffffffffe50,
                         (duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffe48);
  ceil((double)benchmark);
  dVar1 = std::chrono::operator/
                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffe48,
                     (int *)in_stack_fffffffffffffe40);
  iVar3 = (int)((ulong)dVar1.__r >> 0x20);
  dVar1 = std::chrono::operator*
                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffe48,
                     (int *)in_stack_fffffffffffffe40);
  __d = std::chrono::operator*
                  ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffe48,
                   (int *)in_stack_fffffffffffffe40);
  std::chrono::duration<double,std::ratio<1l,1000000000l>>::
  duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,_std::ratio<1L,_1000000000L>_> *)dVar1.__r,
             (duration<long,_std::ratio<1L,_1000000000L>_> *)__d.__r);
  parameters::parameters(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  nonius::detail::benchmark_function::benchmark_function
            ((benchmark_function *)in_stack_fffffffffffffe40,
             (benchmark_function *)in_stack_fffffffffffffe38);
  std::chrono::
  duration_cast<std::chrono::duration<double,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000l>>
            ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffe38);
  execution_plan<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>::execution_plan
            ((execution_plan<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *)
             TVar2.elapsed.__r.__r,TVar2.iterations,estimated_duration,(parameters *)params_00.__r,
             benchmark,warmup_time,iVar3);
  nonius::detail::benchmark_function::~benchmark_function((benchmark_function *)0x24d263);
  parameters::~parameters((parameters *)0x24d270);
  nonius::detail::benchmark_function::~benchmark_function((benchmark_function *)0x24d27d);
  return in_RDI;
}

Assistant:

execution_plan<FloatDuration<Clock>> prepare(configuration cfg, parameters params, environment<FloatDuration<Clock>> env) const {
            auto bench = fun(params);
            auto min_time = env.clock_resolution.mean * detail::minimum_ticks;
            auto run_time = std::max(min_time, chrono::duration_cast<decltype(min_time)>(detail::warmup_time));
            auto&& test = detail::run_for_at_least<Clock>(params, chrono::duration_cast<Duration<Clock>>(run_time), 1, bench);
            int new_iters = static_cast<int>(std::ceil(min_time * test.iterations / test.elapsed));
            return { new_iters, test.elapsed / test.iterations * new_iters * cfg.samples, params, bench, chrono::duration_cast<FloatDuration<Clock>>(detail::warmup_time), detail::warmup_iterations };
        }